

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O2

void assertEquals<int,unsigned_long>(int t1,unsigned_long t2)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  if ((long)t1 == t2) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_190,"Assertion failed: ");
  poVar1 = std::operator<<(local_190,"Expected:");
  std::ostream::operator<<(poVar1,t1);
  poVar1 = std::operator<<(local_190,", Got:");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void assertEquals(T1 t1, T2 t2)
{
	if(!(t1 == t2))
	{
		std::stringstream ss;
		ss << "Assertion failed: ";
		ss << "Expected:" << t1;
		ss << ", Got:" << t2;
		throw std::runtime_error(ss.str());
	}
}